

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall
van_kampen::Graph::mergeNodes
          (Graph *this,nodeId_t alive,nodeId_t dead,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *untouchable)

{
  _Elt_pointer pTVar1;
  _Elt_pointer pTVar2;
  Graph *this_00;
  reference pvVar3;
  const_iterator cVar4;
  _Map_pointer ppTVar5;
  _Elt_pointer pTVar6;
  _Elt_pointer pTVar7;
  _Elt_pointer pTVar8;
  _Map_pointer ppTVar9;
  Transition *edgeFromDead;
  _Elt_pointer __k;
  __node_gen_type __node_gen;
  nodeId_t local_54;
  Graph *local_50;
  size_type local_48;
  _Elt_pointer local_40;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *local_38;
  
  local_54 = dead;
  local_50 = this;
  pvVar3 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::at
                     (&this->nodes_,(long)dead);
  __k = (pvVar3->transitions_).
        super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur;
  pTVar1 = (pvVar3->transitions_).
           super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (__k != pTVar1) {
    pTVar7 = (pvVar3->transitions_).
             super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    ppTVar9 = (pvVar3->transitions_).
              super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    local_48 = (size_type)alive;
    do {
      cVar4 = std::
              _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&untouchable->_M_h,&__k->to);
      this_00 = local_50;
      if (cVar4.super__Node_iterator_base<int,_false>._M_cur == (__node_type *)0x0) {
        local_40 = pTVar7;
        pvVar3 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::at
                           (&local_50->nodes_,local_48);
        Node::addTransition(pvVar3,__k->to,&__k->label,false,false);
        pTVar7 = local_40;
        pvVar3 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::at
                           (&this_00->nodes_,(long)__k->to);
        pTVar6 = (pvVar3->transitions_).
                 super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
        pTVar2 = (pvVar3->transitions_).
                 super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pTVar6 != pTVar2) {
          pTVar8 = (pvVar3->transitions_).
                   super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last;
          ppTVar5 = (pvVar3->transitions_).
                    super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
          do {
            if (pTVar6->to == local_54) {
              pTVar6->to = alive;
            }
            pTVar6 = pTVar6 + 1;
            if (pTVar6 == pTVar8) {
              pTVar6 = ppTVar5[1];
              ppTVar5 = ppTVar5 + 1;
              pTVar8 = pTVar6 + 7;
            }
          } while (pTVar6 != pTVar2);
        }
      }
      __k = __k + 1;
      if (__k == pTVar7) {
        __k = ppTVar9[1];
        ppTVar9 = ppTVar9 + 1;
        pTVar7 = __k + 7;
      }
    } while (__k != pTVar1);
  }
  local_38 = &local_50->removedNodes_;
  std::
  _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
            ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_38,&local_54);
  return;
}

Assistant:

void Graph::mergeNodes(nodeId_t alive, nodeId_t dead, const std::unordered_set<nodeId_t> &untouchable)
{
    for (Transition &edgeFromDead : node(dead).transitions())
    {
        if (untouchable.count(edgeFromDead.to))
        {
            continue;
        }
        node(alive).addTransition(edgeFromDead.to, edgeFromDead.label, false, false); // TODO
        for (Transition &edge : node(edgeFromDead.to).transitions())
        {
            if (edge.to == dead)
            {
                edge.to = alive;
            }
        }
    }
    removedNodes_.insert(dead);
}